

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O2

FT_Error FT_Done_Size(FT_Size size)

{
  FT_Face pFVar1;
  FT_Driver driver;
  FT_Memory memory;
  FT_ListNode pFVar2;
  FT_ListNode pFVar3;
  FT_ListNode pFVar4;
  FT_Error FVar5;
  FT_ListRec *pFVar6;
  FT_ListNode pFVar7;
  
  FVar5 = 0x24;
  if (size != (FT_Size)0x0) {
    pFVar1 = size->face;
    if (pFVar1 == (FT_Face)0x0) {
      FVar5 = 0x23;
    }
    else {
      driver = pFVar1->driver;
      if (driver == (FT_Driver)0x0) {
        FVar5 = 0x22;
      }
      else {
        memory = (driver->root).memory;
        pFVar4 = FT_List_Find(&pFVar1->sizes_list,size);
        if (pFVar4 != (FT_ListNode)0x0) {
          pFVar2 = pFVar4->prev;
          pFVar3 = pFVar4->next;
          pFVar6 = (FT_ListRec *)&pFVar2->next;
          if (pFVar2 == (FT_ListNode)0x0) {
            pFVar6 = &pFVar1->sizes_list;
          }
          pFVar6->head = pFVar3;
          pFVar7 = (FT_ListNode)&(pFVar1->sizes_list).tail;
          if (pFVar3 != (FT_ListNode)0x0) {
            pFVar7 = pFVar3;
          }
          pFVar7->prev = pFVar2;
          (*memory->free)(memory,pFVar4);
          if (pFVar1->size == size) {
            pFVar1->size = (FT_Size)0x0;
            pFVar4 = (pFVar1->sizes_list).head;
            if (pFVar4 != (FT_ListNode)0x0) {
              pFVar1->size = (FT_Size)pFVar4->data;
            }
          }
          destroy_size(memory,size,driver);
          FVar5 = 0;
        }
      }
    }
  }
  return FVar5;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Done_Size( FT_Size  size )
  {
    FT_Error     error;
    FT_Driver    driver;
    FT_Memory    memory;
    FT_Face      face;
    FT_ListNode  node;


    if ( !size )
      return FT_THROW( Invalid_Size_Handle );

    face = size->face;
    if ( !face )
      return FT_THROW( Invalid_Face_Handle );

    driver = face->driver;
    if ( !driver )
      return FT_THROW( Invalid_Driver_Handle );

    memory = driver->root.memory;

    error = FT_Err_Ok;
    node  = FT_List_Find( &face->sizes_list, size );
    if ( node )
    {
      FT_List_Remove( &face->sizes_list, node );
      FT_FREE( node );

      if ( face->size == size )
      {
        face->size = NULL;
        if ( face->sizes_list.head )
          face->size = (FT_Size)(face->sizes_list.head->data);
      }

      destroy_size( memory, size, driver );
    }
    else
      error = FT_THROW( Invalid_Size_Handle );

    return error;
  }